

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedClasses.cpp
# Opt level: O0

void chatra::String::native_equals
               (NativeCallHandler handler,Thread *thread,ObjectBase *object,StringId name,
               StringId subName,Tuple *args,Reference ret)

{
  bool bVar1;
  __type newValue;
  ReferenceValueType RVar2;
  String *pSVar3;
  ObjectBase *this;
  Class *pCVar4;
  Class *pCVar5;
  lock_guard<chatra::SpinLock> local_b0;
  lock_guard<chatra::SpinLock> lock_1;
  String *target;
  string rValue;
  lock_guard<chatra::SpinLock> local_70;
  lock_guard<chatra::SpinLock> lock;
  string lValue;
  Reference value;
  String *self;
  Tuple *args_local;
  StringId subName_local;
  StringId name_local;
  ObjectBase *object_local;
  Thread *thread_local;
  NativeCallHandler handler_local;
  Reference ret_local;
  
  handler_local = (NativeCallHandler)ret.node;
  pSVar3 = NativeSelf<chatra::String>::getSelf(object);
  lValue.field_2._8_8_ = Object::ref((Object *)args,0);
  bVar1 = Reference::isNull((Reference *)((long)&lValue.field_2 + 8));
  if ((!bVar1) &&
     (RVar2 = Reference::valueType((Reference *)((long)&lValue.field_2 + 8)), RVar2 == Object)) {
    this = Reference::deref<chatra::ObjectBase>((Reference *)((long)&lValue.field_2 + 8));
    pCVar4 = ObjectBase::getClass(this);
    pCVar5 = getClassStatic();
    if (pCVar4 == pCVar5) {
      std::__cxx11::string::string((string *)&lock);
      std::lock_guard<chatra::SpinLock>::lock_guard(&local_70,&pSVar3->lockValue);
      std::__cxx11::string::operator=((string *)&lock,(string *)&pSVar3->value);
      std::lock_guard<chatra::SpinLock>::~lock_guard(&local_70);
      std::__cxx11::string::string((string *)&target);
      lock_1._M_device =
           (mutex_type *)Reference::deref<chatra::String>((Reference *)((long)&lValue.field_2 + 8));
      std::lock_guard<chatra::SpinLock>::lock_guard
                (&local_b0,&((String *)lock_1._M_device)->lockValue);
      std::__cxx11::string::operator=((string *)&target,(string *)(lock_1._M_device + 0xb8));
      std::lock_guard<chatra::SpinLock>::~lock_guard(&local_b0);
      newValue = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&lock,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&target);
      Reference::setBool((Reference *)&handler_local,newValue);
      std::__cxx11::string::~string((string *)&target);
      std::__cxx11::string::~string((string *)&lock);
      return;
    }
  }
  Reference::setBool((Reference *)&handler_local,false);
  return;
}

Assistant:

void String::native_equals(CHATRA_NATIVE_ARGS) {
	CHATRA_NATIVE_SELF;

	auto value = args.ref(0);
	if (value.isNull() || value.valueType() != ReferenceValueType::Object ||
			value.deref<ObjectBase>().getClass() != getClassStatic()) {
		ret.setBool(false);
		return;
	}

	std::string lValue;
	{
		std::lock_guard<SpinLock> lock(self.lockValue);
		lValue = self.value;
	}

	std::string rValue;
	{
		auto& target = value.deref<String>();
		std::lock_guard<SpinLock> lock(target.lockValue);
		rValue = target.value;
	}

	ret.setBool(lValue == rValue);
}